

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O3

cubeb_resampler *
cubeb_resampler_create
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  cubeb_stream_params *pcVar5;
  cubeb_resampler *pcVar6;
  cubeb_resampler_speex_one_way<float> *this;
  cubeb_resampler_speex_one_way<float> *this_00;
  delay_line<float> *pdVar7;
  passthrough_resampler<float> *this_01;
  cubeb_data_callback p_Var8;
  code *pcVar9;
  uint32_t uVar10;
  uint source_rate;
  delay_line<float> *pdStackY_48;
  delay_line<float> *pdStackY_40;
  cubeb_stream *pcStackY_38;
  
  pcVar5 = input_params;
  if (input_params == (cubeb_stream_params *)0x0) {
    pcVar5 = output_params;
  }
  if (pcVar5->format != CUBEB_SAMPLE_FLOAT32LE) {
    if (pcVar5->format != CUBEB_SAMPLE_S16LE) {
      return (cubeb_resampler *)0x0;
    }
    pcVar6 = cubeb_resampler_create_internal<short>
                       (stream,input_params,output_params,target_rate,callback,user_ptr,quality,
                        reclock);
    return pcVar6;
  }
  pdStackY_40 = (delay_line<float> *)0x0;
  pdStackY_48 = (delay_line<float> *)0x0;
  pcStackY_38 = stream;
  if (input_params == (cubeb_stream_params *)0x0) {
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_0010fb34;
    pdVar7 = (delay_line<float> *)0x0;
    this = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_0010fd5a:
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Resampling output (%dHz) to target and input rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x244,(ulong)output_params->rate,target_rate);
      pdVar7 = pdStackY_40;
    }
    this_01 = (passthrough_resampler<float> *)operator_new(0x48);
    pdStackY_40 = (delay_line<float> *)0x0;
    (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_00148208;
    *(delay_line<float> **)&this_01->super_processor = pdVar7;
    this_01->stream = (cubeb_stream *)this;
    (this_01->internal_input_buffer).data_ = (float *)pcStackY_38;
    (this_01->internal_input_buffer).capacity_ = (size_t)callback;
    (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
    *(undefined1 *)&this_01->sample_rate = 0;
    if (this == (cubeb_resampler_speex_one_way<float> *)0x0 && pdVar7 == (delay_line<float> *)0x0)
    goto LAB_0010ff61;
    pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
             ::fill_internal_duplex;
    if (pdVar7 == (delay_line<float> *)0x0) {
      pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
               ::fill_internal_input;
    }
    if (this == (cubeb_resampler_speex_one_way<float> *)0x0) {
      pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
               ::fill_internal_input;
    }
    p_Var8 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
             ::fill_internal_output;
    if (pdVar7 != (delay_line<float> *)0x0) {
      p_Var8 = pcVar9;
    }
    this_01->data_callback = p_Var8;
  }
  else {
    source_rate = input_params->rate;
    if (output_params != (cubeb_stream_params *)0x0 && source_rate == target_rate) {
LAB_0010fb34:
      if (output_params->rate == target_rate) {
LAB_0010fb3a:
        if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Input and output sample-rate match, target rate of %dHz\n",
                     "cubeb_resampler_internal.h",0x206,target_rate);
        }
        this_01 = (passthrough_resampler<float> *)operator_new(0x48);
        if (input_params == (cubeb_stream_params *)0x0) {
          uVar10 = 0;
        }
        else {
          uVar10 = input_params->channels;
        }
        passthrough_resampler<float>::passthrough_resampler
                  (this_01,pcStackY_38,callback,user_ptr,uVar10,target_rate);
        goto LAB_0010ff61;
      }
LAB_0010fb8f:
      uVar10 = output_params->rate;
      if (uVar10 == target_rate) {
        this = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else {
        this = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
        iVar3 = -1;
        if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
          iVar3 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
        }
        cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                  (this,output_params->channels,target_rate,uVar10,iVar3);
      }
      if (input_params != (cubeb_stream_params *)0x0) {
        source_rate = input_params->rate;
        bVar2 = true;
        goto LAB_0010fbf1;
      }
      bVar2 = true;
LAB_0010fcaf:
      if (this == (cubeb_resampler_speex_one_way<float> *)0x0) {
        pdVar7 = (delay_line<float> *)0x0;
        this = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else if (bVar2 && input_params != (cubeb_stream_params *)0x0) {
        pdVar7 = (delay_line<float> *)operator_new(0x48);
        iVar3 = speex_resampler_get_output_latency(this->speex_resampler);
        uVar4 = iVar3 + this->additional_latency;
        uVar10 = input_params->channels;
        uVar1 = output_params->rate;
        (pdVar7->super_processor).channels = uVar10;
        pdVar7->length = uVar4;
        pdVar7->leftover_samples = 0;
        (pdVar7->delay_output_buffer).capacity_ = 0;
        (pdVar7->delay_output_buffer).length_ = 0;
        (pdVar7->delay_input_buffer).length_ = 0;
        (pdVar7->delay_output_buffer).data_ = (float *)0x0;
        (pdVar7->delay_input_buffer).data_ = (float *)0x0;
        (pdVar7->delay_input_buffer).capacity_ = 0;
        pdVar7->sample_rate = uVar1;
        auto_array<float>::push_silence(&pdVar7->delay_input_buffer,(ulong)(uVar10 * uVar4));
        pdStackY_40 = pdVar7;
      }
      else {
        pdVar7 = (delay_line<float> *)0x0;
      }
      goto LAB_0010fd5a;
    }
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_0010fb8f;
    if (source_rate == target_rate) goto LAB_0010fb3a;
    this = (cubeb_resampler_speex_one_way<float> *)0x0;
    bVar2 = false;
LAB_0010fbf1:
    if (source_rate == target_rate) goto LAB_0010fcaf;
    this_00 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
    iVar3 = -1;
    if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
      iVar3 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
    }
    cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
              (this_00,input_params->channels,source_rate,target_rate,iVar3);
    if ((bool)(bVar2 & input_params != (cubeb_stream_params *)0x0 &
              this == (cubeb_resampler_speex_one_way<float> *)0x0)) {
      pdVar7 = (delay_line<float> *)operator_new(0x48);
      iVar3 = speex_resampler_get_output_latency(this_00->speex_resampler);
      uVar4 = iVar3 + this_00->additional_latency;
      uVar10 = output_params->rate;
      uVar1 = output_params->channels;
      (pdVar7->super_processor).channels = uVar1;
      pdVar7->length = uVar4;
      pdVar7->leftover_samples = 0;
      (pdVar7->delay_output_buffer).capacity_ = 0;
      (pdVar7->delay_output_buffer).length_ = 0;
      (pdVar7->delay_input_buffer).length_ = 0;
      (pdVar7->delay_output_buffer).data_ = (float *)0x0;
      (pdVar7->delay_input_buffer).data_ = (float *)0x0;
      (pdVar7->delay_input_buffer).capacity_ = 0;
      pdVar7->sample_rate = uVar10;
      auto_array<float>::push_silence(&pdVar7->delay_input_buffer,(ulong)(uVar1 * uVar4));
      pdStackY_48 = pdVar7;
LAB_0010fec0:
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Resampling input (%d) to target and output rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x23d,(ulong)input_params->rate,(ulong)target_rate);
        pdVar7 = pdStackY_48;
      }
      this_01 = (passthrough_resampler<float> *)operator_new(0x48);
      pdStackY_48 = (delay_line<float> *)0x0;
      (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_001481d8;
      *(cubeb_resampler_speex_one_way<float> **)&this_01->super_processor = this_00;
      this_01->stream = (cubeb_stream *)pdVar7;
      (this_01->internal_input_buffer).data_ = (float *)pcStackY_38;
      (this_01->internal_input_buffer).capacity_ = (size_t)callback;
      (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
      *(undefined1 *)&this_01->sample_rate = 0;
      pcVar9 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
               ::fill_internal_duplex;
      if (pdVar7 == (delay_line<float> *)0x0) {
        pcVar9 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                 ::fill_internal_input;
      }
      this_01->data_callback = pcVar9;
      this_01->user_ptr = (void *)0x0;
      goto LAB_0010ff61;
    }
    if (this == (cubeb_resampler_speex_one_way<float> *)0x0) {
      pdVar7 = (delay_line<float> *)0x0;
      goto LAB_0010fec0;
    }
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Resampling input (%d) and output (%d) to target rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x236,(ulong)input_params->rate,
                 (ulong)output_params->rate,(ulong)target_rate);
    }
    this_01 = (passthrough_resampler<float> *)operator_new(0x48);
    (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_001481a8;
    *(cubeb_resampler_speex_one_way<float> **)&this_01->super_processor = this_00;
    this_01->stream = (cubeb_stream *)this;
    (this_01->internal_input_buffer).data_ = (float *)pcStackY_38;
    (this_01->internal_input_buffer).capacity_ = (size_t)callback;
    (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
    *(undefined1 *)&this_01->sample_rate = 0;
    this_01->data_callback =
         cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
         ::fill_internal_duplex;
  }
  this_01->user_ptr = (void *)0x0;
LAB_0010ff61:
  if (pdStackY_48 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&pdStackY_48,pdStackY_48);
  }
  if (pdStackY_40 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&pdStackY_40,pdStackY_40);
  }
  return &this_01->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create(cubeb_stream * stream,
                       cubeb_stream_params * input_params,
                       cubeb_stream_params * output_params,
                       unsigned int target_rate, cubeb_data_callback callback,
                       void * user_ptr, cubeb_resampler_quality quality,
                       cubeb_resampler_reclock reclock)
{
  cubeb_sample_format format;

  assert(input_params || output_params);

  if (input_params) {
    format = input_params->format;
  } else {
    format = output_params->format;
  }

  switch (format) {
  case CUBEB_SAMPLE_S16NE:
    return cubeb_resampler_create_internal<short>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  case CUBEB_SAMPLE_FLOAT32NE:
    return cubeb_resampler_create_internal<float>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  default:
    assert(false);
    return nullptr;
  }
}